

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O0

void * mi_new_nothrow(size_t size)

{
  size_t in_RDI;
  void *p;
  void *local_8;
  
  local_8 = mi_malloc(0x4525d3);
  if (local_8 == (void *)0x0) {
    local_8 = mi_try_new(in_RDI,false);
  }
  return local_8;
}

Assistant:

void* mi_new_nothrow(size_t size) mi_attr_noexcept {
  void* p = mi_malloc(size);
  if mi_unlikely(p == NULL) return mi_try_new(size, true);
  return p;
}